

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O0

void __thiscall QHttpThreadDelegate::startRequestSynchronously(QHttpThreadDelegate *this)

{
  QScopedValueRollback<QEventLoop_*> *in_RDI;
  long in_FS_OFFSET;
  QScopedValueRollback<QEventLoop_*> guard;
  QEventLoop synchronousRequestLoop;
  undefined4 in_stack_ffffffffffffff98;
  ProcessEventsFlag flags;
  QEventLoop *in_stack_ffffffffffffffa8;
  ConnectionType c;
  QThreadStorage<QNetworkAccessCache_*> *this_00;
  char *member;
  QScopedValueRollback<QEventLoop_*> *this_01;
  QScopedValueRollback<QEventLoop_*> local_28;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 *)&in_RDI[8].oldValue = 1;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  uStack_10 = 0xaaaaaaaaaaaaaaaa;
  flags = AllEvents;
  member = (char *)0x0;
  QEventLoop::QEventLoop((QEventLoop *)&local_18,(QObject *)0x0);
  local_28.varRef = (QEventLoop **)0xaaaaaaaaaaaaaaaa;
  local_28.oldValue = (QEventLoop *)0xaaaaaaaaaaaaaaaa;
  this_01 = &local_28;
  QScopedValueRollback<QEventLoop_*>::QScopedValueRollback
            (in_RDI,(QEventLoop **)CONCAT44(flags,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffffa8);
  c = (ConnectionType)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  QTimer::singleShot((int)((ulong)this_01 >> 0x20),(QObject *)in_RDI,
                     (char *)CONCAT44(flags,in_stack_ffffffffffffff98));
  QMetaObject::invokeMethod<>((QObject *)this_01,member,c);
  QFlags<QEventLoop::ProcessEventsFlag>::QFlags
            ((QFlags<QEventLoop::ProcessEventsFlag> *)in_RDI,flags);
  QEventLoop::exec((QFlags_conflict *)&local_18);
  this_00 = &connections;
  QThreadStorage<QNetworkAccessCache_*>::localData
            ((QThreadStorage<QNetworkAccessCache_*> *)0x30d509);
  QNetworkAccessCache::releaseEntry((QNetworkAccessCache *)this_00,(QByteArray *)in_RDI);
  QThreadStorage<QNetworkAccessCache_*>::setLocalData
            ((QThreadStorage<QNetworkAccessCache_*> *)0x30d52c,
             (QNetworkAccessCache *)CONCAT44(flags,in_stack_ffffffffffffff98));
  QScopedValueRollback<QEventLoop_*>::~QScopedValueRollback(this_01);
  QEventLoop::~QEventLoop((QEventLoop *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::startRequestSynchronously()
{
#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::startRequestSynchronously() thread=" << QThread::currentThreadId();
#endif
    synchronous = true;

    QEventLoop synchronousRequestLoop;
    QScopedValueRollback<QEventLoop*> guard(this->synchronousRequestLoop, &synchronousRequestLoop);

    // Worst case timeout
    QTimer::singleShot(30*1000, this, SLOT(abortRequest()));

    QMetaObject::invokeMethod(this, "startRequest", Qt::QueuedConnection);
    synchronousRequestLoop.exec();

    connections.localData()->releaseEntry(cacheKey);
    connections.setLocalData(nullptr);

#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::startRequestSynchronously() thread=" << QThread::currentThreadId() << "finished";
#endif
}